

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3a28a9::BNTest_ShiftTestVectors_Test::TestBody
          (BNTest_ShiftTestVectors_Test *this)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(FileTest_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc:1033:17)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(FileTest_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc:1033:17)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  FileTestGTest("crypto/fipsmodule/bn/test/shift_tests.txt",(function<void_(FileTest_*)> *)&local_28
               );
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

TEST_F(BNTest, ShiftTestVectors) {
  FileTestGTest("crypto/fipsmodule/bn/test/shift_tests.txt",
                [&](FileTest *t) { RunBNFileTest(t, ctx()); });
}